

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O2

void SN76489_Update(SN76489_Context *chip,UINT32 length,DEV_SMPL **buffer)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  DEV_SMPL *pDVar5;
  DEV_SMPL *pDVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  UINT32 UVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  SN76489_Context *pSVar14;
  int iVar15;
  SN76489_Context *pSVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  
  bVar1 = chip->NgpFlags;
  pSVar16 = chip;
  if (bVar1 == 0) {
    bVar18 = true;
    pSVar14 = chip;
  }
  else {
    bVar18 = (bVar1 & 1) == 0;
    pSVar14 = chip->NgpChip2;
    if (!bVar18) {
      pSVar14 = chip;
      pSVar16 = chip->NgpChip2;
    }
  }
  uVar17 = 0;
  do {
    if (uVar17 == length) {
      return;
    }
    bVar2 = pSVar16->Mute;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      if ((bVar2 >> ((uint)lVar11 & 0x1f) & 1) == 0) {
        fVar19 = 0.0;
      }
      else {
        fVar19 = pSVar16->IntermediatePos[lVar11];
        if ((fVar19 == 1.1754944e-38) && (!NAN(fVar19))) {
          fVar19 = (float)pSVar16->ToneFreqPos[lVar11];
        }
      }
      chip->ChannelState[lVar11] = fVar19;
    }
    fVar19 = 0.0;
    if ((bVar2 & 8) == 0) {
LAB_00122bf8:
      chip->ChannelState[3] = fVar19;
    }
    else {
      fVar19 = (float)(int)((pSVar14->NoiseShiftRegister & 1) * 2 + -1);
      chip->ChannelState[3] = fVar19;
      if ((pSVar14->Registers[6] & 4) != 0) {
        fVar19 = fVar19 * 0.5;
        goto LAB_00122bf8;
      }
    }
    pDVar5 = *buffer;
    pDVar5[uVar17] = 0;
    pDVar6 = buffer[1];
    pDVar6[uVar17] = 0;
    if (bVar1 == 0) {
      bVar2 = chip->PSGStereo;
      for (lVar11 = -4; lVar11 != 0; lVar11 = lVar11 + 1) {
        iVar15 = (int)((float)PSGVolumeValues[(ushort)chip->ToneFreqVals[lVar11 + -2]] *
                      (float)chip->panning[0][lVar11]);
        bVar7 = bVar2 >> ((char)lVar11 + 4U & 0x1f);
        if ((~bVar7 & 0x11) == 0) {
          pDVar5[uVar17] = pDVar5[uVar17] + (chip->panning[lVar11 + 4][0] * iVar15 >> 0x10);
          iVar15 = iVar15 * chip->panning[lVar11 + 4][1] >> 0x10;
        }
        else {
          iVar9 = 0;
          if ((bVar2 >> ((byte)((char)lVar11 + 4U | 4) & 0x1f) & 1) != 0) {
            iVar9 = iVar15;
          }
          pDVar5[uVar17] = pDVar5[uVar17] + iVar9;
          if ((bVar7 & 1) == 0) {
            iVar15 = 0;
          }
        }
        pDVar6[uVar17] = iVar15 + pDVar6[uVar17];
      }
    }
    else if (bVar18) {
      bVar2 = chip->PSGStereo;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        fVar19 = chip->ChannelState[lVar11];
        iVar15 = (int)((float)PSGVolumeValues[(ushort)pSVar16->ToneFreqVals[lVar11 + -6]] * fVar19);
        if ((bVar2 >> ((byte)((byte)lVar11 | 4) & 0x1f) & 1) == 0) {
          iVar15 = 0;
        }
        pDVar5[uVar17] = pDVar5[uVar17] + iVar15;
        iVar15 = (int)((float)PSGVolumeValues[(ushort)pSVar14->ToneFreqVals[lVar11 + -6]] * fVar19);
        if ((bVar2 >> ((uint)lVar11 & 0x1f) & 1) == 0) {
          iVar15 = 0;
        }
        pDVar6[uVar17] = pDVar6[uVar17] + iVar15;
      }
    }
    else {
      bVar2 = chip->PSGStereo;
      pDVar5[uVar17] =
           pDVar5[uVar17] +
           (uint)(bVar2 >> 7) * (int)((float)PSGVolumeValues[pSVar16->Registers[7]] * fVar19);
      pDVar6[uVar17] =
           pDVar6[uVar17] +
           (bVar2 >> 3 & 1) * (int)((float)PSGVolumeValues[pSVar14->Registers[7]] * fVar19);
    }
    fVar19 = chip->dClock + chip->Clock;
    uVar12 = (ulong)fVar19;
    UVar10 = (UINT32)uVar12;
    fVar20 = (float)(uVar12 & 0xffffffff);
    chip->NumClocksForSample = UVar10;
    fVar19 = fVar19 - fVar20;
    chip->Clock = fVar19;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      chip->ToneFreqVals[lVar11] = chip->ToneFreqVals[lVar11] - UVar10;
    }
    uVar3 = chip->NoiseFreq;
    if (uVar3 == 0x80) {
      iVar15 = chip->ToneFreqVals[2];
    }
    else {
      iVar15 = chip->ToneFreqVals[3] - UVar10;
    }
    chip->ToneFreqVals[3] = iVar15;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      iVar15 = chip->ToneFreqVals[lVar11];
      if (iVar15 < 1) {
        uVar4 = chip->Registers[lVar11 * 2];
        if (uVar4 < 6) {
          chip->ToneFreqPos[lVar11] = 1;
          chip->IntermediatePos[lVar11] = 1.1754944e-38;
        }
        else {
          chip->IntermediatePos[lVar11] =
               ((float)chip->ToneFreqPos[lVar11] * ((float)(iVar15 * 2) + (fVar20 - fVar19))) /
               (fVar19 + fVar20);
          chip->ToneFreqPos[lVar11] = -chip->ToneFreqPos[lVar11];
        }
        chip->ToneFreqVals[lVar11] =
             ((int)((uVar12 & 0xffffffff) / (ulong)(uint)uVar4) + 1) * (uint)uVar4 + iVar15;
      }
      else {
        chip->IntermediatePos[lVar11] = 1.1754944e-38;
      }
    }
    if (chip->ToneFreqVals[3] < 1) {
      iVar15 = chip->ToneFreqPos[3];
      chip->ToneFreqPos[3] = -iVar15;
      if (uVar3 != 0x80) {
        chip->ToneFreqVals[3] =
             ((int)((uVar12 & 0xffffffff) / (ulong)uVar3) + 1) * (uint)uVar3 + chip->ToneFreqVals[3]
        ;
      }
      if (iVar15 == -1) {
        if ((chip->Registers[6] & 4) == 0) {
          uVar8 = chip->NoiseShiftRegister;
          uVar13 = uVar8;
LAB_00122ed9:
          uVar13 = uVar13 & 1;
        }
        else {
          uVar13 = chip->WhiteNoiseFeedback;
          if ((uVar13 != 9) && (uVar13 != 3)) {
            uVar8 = chip->NoiseShiftRegister;
            uVar13 = (uVar13 & uVar8) >> 8 ^ uVar13 & uVar8;
            uVar13 = uVar13 >> 4 ^ uVar13;
            uVar13 = uVar13 >> 2 ^ uVar13;
            uVar13 = uVar13 >> 1 ^ uVar13;
            goto LAB_00122ed9;
          }
          uVar8 = chip->NoiseShiftRegister;
          uVar13 = (uint)((uVar8 & uVar13) != uVar13 && (uVar8 & uVar13) != 0);
        }
        chip->NoiseShiftRegister = uVar13 << (chip->SRWidth - 1 & 0x1f) | uVar8 >> 1;
      }
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

static void SN76489_Update(SN76489_Context* chip, UINT32 length, DEV_SMPL **buffer)
{
	UINT32 i, j;
	SN76489_Context* chip_t;
	SN76489_Context* chip_n;
	
	if (! chip->NgpFlags)
	{
		chip_t = chip_n = chip;
	}
	else
	{
		if (! (chip->NgpFlags & 0x01))
		{
			chip_t = chip;
			chip_n = chip->NgpChip2;
		}
		else
		{
			chip_t = chip->NgpChip2;
			chip_n = chip;
		}
	}
	
	for( j = 0; j < length; j++ )
	{
		/* Tone channels */
		for ( i = 0; i <= 2; ++i )
			if ( (chip_t->Mute >> i) & 1 )
			{
				if ( chip_t->IntermediatePos[i] != FLT_MIN )
					/* Intermediate position (antialiasing) */
					chip->ChannelState[i] = chip_t->IntermediatePos[i];
				else
					/* Flat (no antialiasing needed) */
					chip->ChannelState[i] = (float)chip_t->ToneFreqPos[i];
			}
			else
				/* Muted channel */
				chip->ChannelState[i] = 0.0f;

		/* Noise channel */
		if ( (chip_t->Mute >> 3) & 1 )
		{
			//chip->Channels[3] = PSGVolumeValues[chip->Registers[7]] * ( chip_n->NoiseShiftRegister & 0x1 ) * 2; /* double noise volume */
			// Now the noise is bipolar, too. -Valley Bell
			chip->ChannelState[3] = (float)( (int)( chip_n->NoiseShiftRegister & 0x1 ) * 2 - 1 );
			// due to the way the white noise works here, it seems twice as loud as it should be
			if (chip_n->Registers[6] & 0x4 )
				chip->ChannelState[3] /= 2.0f;
		}
		else
			chip->ChannelState[3] = 0.0f;

		// Build stereo result into buffer
		buffer[0][j] = 0;
		buffer[1][j] = 0;
		if (! chip->NgpFlags)
		{
			// For all 4 channels
			for ( i = 0; i <= 3; ++i )
			{
				int chnOut = (int)(PSGVolumeValues[chip->Registers[2 * i + 1]] * chip->ChannelState[i]);
				if ( ( ( chip->PSGStereo >> i ) & 0x11 ) == 0x11 )
				{
					// no GG stereo for this channel
					buffer[0][j] += APPLY_PANNING_S( chnOut, chip->panning[i][0] ); // left
					buffer[1][j] += APPLY_PANNING_S( chnOut, chip->panning[i][1] ); // right
				}
				else
				{
					// GG stereo overrides panning
					buffer[0][j] += ( chip->PSGStereo >> (i+4) & 0x1 ) * chnOut; // left
					buffer[1][j] += ( chip->PSGStereo >>  i    & 0x1 ) * chnOut; // right
				}
			}
		}
		else
		{
			int chnOut;
			if (! (chip->NgpFlags & 0x01))
			{
				// For all 3 tone channels
				for (i = 0; i < 3; i ++)
				{
					chnOut = (int)(PSGVolumeValues[chip_t->Registers[2 * i + 1]] * chip->ChannelState[i]);
					buffer[0][j] += (chip->PSGStereo >> (i+4) & 0x1 ) * chnOut; // left
					chnOut = (int)(PSGVolumeValues[chip_n->Registers[2 * i + 1]] * chip->ChannelState[i]);
					buffer[1][j] += (chip->PSGStereo >>  i    & 0x1 ) * chnOut; // right
				}
			}
			else
			{
				// noise channel
				i = 3;
				chnOut = (int)(PSGVolumeValues[chip_t->Registers[2 * i + 1]] * chip->ChannelState[i]);
				buffer[0][j] += (chip->PSGStereo >> (i+4) & 0x1 ) * chnOut; // left
				chnOut = (int)(PSGVolumeValues[chip_n->Registers[2 * i + 1]] * chip->ChannelState[i]);
				buffer[1][j] += (chip->PSGStereo >>  i    & 0x1 ) * chnOut; // right
			}
		}

		/* Increment clock by 1 sample length */
		chip->Clock += chip->dClock;
		chip->NumClocksForSample = (UINT32)chip->Clock;   /* truncate */
		chip->Clock -= chip->NumClocksForSample;      /* remove integer part */
	
		/* Decrement tone channel counters */
		for ( i = 0; i <= 2; ++i )
			chip->ToneFreqVals[i] -= chip->NumClocksForSample;
	 
		/* Noise channel: match to tone2 or decrement its counter */
		if ( chip->NoiseFreq == 0x80 )
			chip->ToneFreqVals[3] = chip->ToneFreqVals[2];
		else
			chip->ToneFreqVals[3] -= chip->NumClocksForSample;
	
		/* Tone channels: */
		for ( i = 0; i <= 2; ++i ) {
			if ( chip->ToneFreqVals[i] <= 0 ) {   /* If the counter gets below 0... */
				if (chip->Registers[i*2]>=PSG_CUTOFF) {
					/* For tone-generating values, calculate how much of the sample is + and how much is - */
					/* This is optimised into an even more confusing state than it was in the first place... */
					chip->IntermediatePos[i] = ( chip->NumClocksForSample - chip->Clock + 2 * chip->ToneFreqVals[i] ) * chip->ToneFreqPos[i] / ( chip->NumClocksForSample + chip->Clock );
					/* Flip the flip-flop */
					chip->ToneFreqPos[i] = -chip->ToneFreqPos[i];
				} else {
					/* stuck value */
					chip->ToneFreqPos[i] = 1;
					chip->IntermediatePos[i] = FLT_MIN;
				}
				chip->ToneFreqVals[i] += chip->Registers[i*2] * ( chip->NumClocksForSample / chip->Registers[i*2] + 1 );
			}
			else
				/* signal no antialiasing needed */
				chip->IntermediatePos[i] = FLT_MIN;
		}
	
		/* Noise channel */
		if ( chip->ToneFreqVals[3] <= 0 ) {
			/* If the counter gets below 0... */
			/* Flip the flip-flop */
			chip->ToneFreqPos[3] = -chip->ToneFreqPos[3];
			if (chip->NoiseFreq != 0x80)
				/* If not matching tone2, decrement counter */
				chip->ToneFreqVals[3] += chip->NoiseFreq * ( chip->NumClocksForSample / chip->NoiseFreq + 1 );
			if (chip->ToneFreqPos[3] == 1) {
				/* On the positive edge of the square wave (only once per cycle) */
				UINT32 Feedback;
				if ( chip->Registers[6] & 0x4 ) {
					/* White noise */
					/* Calculate parity of fed-back bits for feedback */
					switch (chip->WhiteNoiseFeedback) {
						/* Do some optimised calculations for common (known) feedback values */
					case 0x0003: /* SC-3000, BBC %00000011 */
					case 0x0009: /* SMS, GG, MD  %00001001 */
						/* If two bits fed back, I can do Feedback=(nsr & fb) && (nsr & fb ^ fb) */
						/* since that's (one or more bits set) && (not all bits set) */
						Feedback = ( ( chip->NoiseShiftRegister & chip->WhiteNoiseFeedback )
							&& ( (chip->NoiseShiftRegister & chip->WhiteNoiseFeedback ) ^ chip->WhiteNoiseFeedback ) );
						break;
					default:
						/* Default handler for all other feedback values */
						/* XOR fold bits into the final bit */
						Feedback = chip->NoiseShiftRegister & chip->WhiteNoiseFeedback;
						Feedback ^= Feedback >> 8;
						Feedback ^= Feedback >> 4;
						Feedback ^= Feedback >> 2;
						Feedback ^= Feedback >> 1;
						Feedback &= 1;
						break;
					}
				} else	  /* Periodic noise */
					Feedback=chip->NoiseShiftRegister&1;

				chip->NoiseShiftRegister=(chip->NoiseShiftRegister>>1) | (Feedback << (chip->SRWidth-1));
			}
		}
	}
}